

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myassert.h
# Opt level: O0

void ASSERT_RE(string *actual,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_38 [8];
  regex re;
  string *expected_local;
  string *actual_local;
  
  re._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)expected;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_38,expected,0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (actual,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38,0);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Assertion failed:\nExpected:\n");
    poVar2 = std::operator<<(poVar2,(string *)expected);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"but got:\n");
    poVar2 = std::operator<<(poVar2,(string *)actual);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38);
  return;
}

Assistant:

void ASSERT_RE(std::string actual, std::string expected) {
  std::regex re(expected);
  if (regex_match(actual, re))
    return;
  std::cerr << "Assertion failed:\n"
               "Expected:\n"
            << expected << "\n"
            << "but got:\n"
            << actual << std::endl;
  std::exit(1);
}